

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemFromBtreeZeroOffset(BtCursor *pCur,u32 amt,Mem *pMem)

{
  u8 *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  puVar1 = (pCur->info).pPayload;
  uVar4 = *(int *)&pCur->pPage->aDataEnd - (int)puVar1;
  uVar5 = 0;
  if (0 < (int)uVar4) {
    uVar5 = uVar4;
  }
  uVar2 = (uint)(pCur->info).nLocal;
  if ((int)uVar2 <= (int)uVar4) {
    uVar5 = uVar2;
  }
  pMem->z = (char *)puVar1;
  if (uVar5 < amt) {
    iVar3 = sqlite3VdbeMemFromBtree(pCur,0,amt,pMem);
    return iVar3;
  }
  pMem->flags = 0x4010;
  pMem->n = amt;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFromBtreeZeroOffset(
  BtCursor *pCur,   /* Cursor pointing at record to retrieve. */
  u32 amt,          /* Number of bytes to return. */
  Mem *pMem         /* OUT: Return data in this Mem structure. */
){
  u32 available = 0;  /* Number of bytes available on the local btree page */
  int rc = SQLITE_OK; /* Return code */

  assert( sqlite3BtreeCursorIsValid(pCur) );
  assert( !VdbeMemDynamic(pMem) );

  /* Note: the calls to BtreeKeyFetch() and DataFetch() below assert()
  ** that both the BtShared and database handle mutexes are held. */
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  pMem->z = (char *)sqlite3BtreePayloadFetch(pCur, &available);
  assert( pMem->z!=0 );

  if( amt<=available ){
    pMem->flags = MEM_Blob|MEM_Ephem;
    pMem->n = (int)amt;
  }else{
    rc = sqlite3VdbeMemFromBtree(pCur, 0, amt, pMem);
  }

  return rc;
}